

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O1

bool __thiscall duckdb::PhysicalOperator::AllSourcesSupportBatchIndex(PhysicalOperator *this)

{
  char cVar1;
  undefined8 *puVar2;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> sources;
  undefined1 local_68 [8];
  void *local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  
  (*this->_vptr_PhysicalOperator[0x25])(&local_48,this);
  for (puVar2 = local_48; puVar2 != local_40; puVar2 = puVar2 + 1) {
    local_68[0] = 1;
    local_60 = (void *)0x0;
    uStack_58 = 0;
    local_50 = 0;
    cVar1 = (**(code **)(*(long *)*puVar2 + 0xa8))((long *)*puVar2,local_68);
    if (local_60 != (void *)0x0) {
      operator_delete(local_60);
    }
    if (cVar1 == '\0') break;
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48);
  }
  return puVar2 == local_40;
}

Assistant:

bool PhysicalOperator::AllSourcesSupportBatchIndex() const {
	auto sources = GetSources();
	for (auto &source : sources) {
		if (!source.get().SupportsPartitioning(OperatorPartitionInfo::BatchIndex())) {
			return false;
		}
	}
	return true;
}